

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_error(char *json,int domain,bson_json_error_code_t code)

{
  size_t sVar1;
  long lVar2;
  undefined8 uVar3;
  char *pcVar4;
  bson_error_t error;
  int local_210;
  int local_20c;
  
  sVar1 = strlen(json);
  lVar2 = bson_new_from_json(json,sVar1,&local_210);
  if (lVar2 == 0) {
    if (local_210 == 1) {
      if (local_20c == domain) {
        return;
      }
      pcVar4 = "error.code == code";
      uVar3 = 0x529;
    }
    else {
      pcVar4 = "error.domain == domain";
      uVar3 = 0x528;
    }
  }
  else {
    pcVar4 = "!bson";
    uVar3 = 0x527;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar3,"test_bson_json_error",pcVar4);
  abort();
}

Assistant:

static void
test_bson_json_error (const char *json, int domain, bson_json_error_code_t code)
{
   bson_error_t error;
   bson_t *bson;

   bson = bson_new_from_json ((const uint8_t *) json, strlen (json), &error);

   BSON_ASSERT (!bson);
   BSON_ASSERT (error.domain == domain);
   BSON_ASSERT (error.code == code);
}